

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

RK_S32 compare_pps(HEVCPPS *openhevc_pps,HEVCPPS *pps)

{
  HEVCPPS *pps_local;
  HEVCPPS *openhevc_pps_local;
  
  if (openhevc_pps->sps_id == pps->sps_id) {
    if (openhevc_pps->pps_id == pps->pps_id) {
      if (openhevc_pps->sign_data_hiding_flag == pps->sign_data_hiding_flag) {
        if (openhevc_pps->cabac_init_present_flag == pps->cabac_init_present_flag) {
          if (openhevc_pps->num_ref_idx_l0_default_active == pps->num_ref_idx_l0_default_active) {
            if (openhevc_pps->num_ref_idx_l1_default_active == pps->num_ref_idx_l1_default_active) {
              if (openhevc_pps->pic_init_qp_minus26 == pps->pic_init_qp_minus26) {
                if (openhevc_pps->constrained_intra_pred_flag == pps->constrained_intra_pred_flag) {
                  if (openhevc_pps->transform_skip_enabled_flag == pps->transform_skip_enabled_flag)
                  {
                    if (openhevc_pps->cu_qp_delta_enabled_flag == pps->cu_qp_delta_enabled_flag) {
                      if (openhevc_pps->diff_cu_qp_delta_depth == pps->diff_cu_qp_delta_depth) {
                        if (openhevc_pps->cb_qp_offset == pps->cb_qp_offset) {
                          if (openhevc_pps->cr_qp_offset == pps->cr_qp_offset) {
                            if (openhevc_pps->pic_slice_level_chroma_qp_offsets_present_flag ==
                                pps->pic_slice_level_chroma_qp_offsets_present_flag) {
                              if (openhevc_pps->weighted_pred_flag == pps->weighted_pred_flag) {
                                if (openhevc_pps->weighted_bipred_flag == pps->weighted_bipred_flag)
                                {
                                  if (openhevc_pps->output_flag_present_flag ==
                                      pps->output_flag_present_flag) {
                                    if (openhevc_pps->transquant_bypass_enable_flag ==
                                        pps->transquant_bypass_enable_flag) {
                                      if (openhevc_pps->dependent_slice_segments_enabled_flag ==
                                          pps->dependent_slice_segments_enabled_flag) {
                                        if (openhevc_pps->tiles_enabled_flag ==
                                            pps->tiles_enabled_flag) {
                                          if (openhevc_pps->entropy_coding_sync_enabled_flag ==
                                              pps->entropy_coding_sync_enabled_flag) {
                                            if (openhevc_pps->num_tile_columns ==
                                                pps->num_tile_columns) {
                                              if (openhevc_pps->num_tile_rows == pps->num_tile_rows)
                                              {
                                                if (openhevc_pps->uniform_spacing_flag ==
                                                    pps->uniform_spacing_flag) {
                                                  if (openhevc_pps->
                                                      loop_filter_across_tiles_enabled_flag ==
                                                      pps->loop_filter_across_tiles_enabled_flag) {
                                                    if (openhevc_pps->
                                                        seq_loop_filter_across_slices_enabled_flag
                                                        == pps->
                                                  seq_loop_filter_across_slices_enabled_flag) {
                                                    if (openhevc_pps->
                                                        deblocking_filter_control_present_flag ==
                                                        pps->deblocking_filter_control_present_flag)
                                                    {
                                                      if (openhevc_pps->
                                                          deblocking_filter_override_enabled_flag ==
                                                          pps->
                                                  deblocking_filter_override_enabled_flag) {
                                                    if (openhevc_pps->disable_dbf ==
                                                        pps->disable_dbf) {
                                                      if (openhevc_pps->beta_offset ==
                                                          pps->beta_offset) {
                                                        if (openhevc_pps->tc_offset ==
                                                            pps->tc_offset) {
                                                          if (openhevc_pps->
                                                              scaling_list_data_present_flag ==
                                                              pps->scaling_list_data_present_flag) {
                                                            if (openhevc_pps->
                                                                lists_modification_present_flag ==
                                                                pps->lists_modification_present_flag
                                                               ) {
                                                              if (openhevc_pps->
                                                                  log2_parallel_merge_level ==
                                                                  pps->log2_parallel_merge_level) {
                                                                if (openhevc_pps->
                                                                    num_extra_slice_header_bits ==
                                                                    pps->num_extra_slice_header_bits
                                                                   ) {
                                                                  openhevc_pps_local._4_4_ = 0;
                                                                }
                                                                else {
                                                                  _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                                                          
                                                  "num_extra_slice_header_bits diff \n",(char *)0x0)
                                                  ;
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "log2_parallel_merge_level diff \n",
                                                               (char *)0x0);
                                                    openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "lists_modification_present_flag diff \n",
                                                  (char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "scaling_list_data_present_flag diff \n",
                                                  (char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS","tc_offset diff \n"
                                                               ,(char *)0x0);
                                                    openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "beta_offset diff \n",(char *)0x0);
                                                    openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "disable_dbf diff \n",(char *)0x0);
                                                    openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "deblocking_filter_override_enabled_flag diff \n",
                                                  (char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "deblocking_filter_control_present_flag diff \n",
                                                  (char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "seq_loop_filter_across_slices_enabled_flag diff \n"
                                                  ,(char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "loop_filter_across_tiles_enabled_flag diff \n",
                                                  (char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                  }
                                                }
                                                else {
                                                  _mpp_log_l(4,"H265PARSER_PS",
                                                             "qp_bd_offset diff \n",(char *)0x0);
                                                  openhevc_pps_local._4_4_ = -1;
                                                }
                                              }
                                              else {
                                                _mpp_log_l(4,"H265PARSER_PS","num_tile_rows diff \n"
                                                           ,(char *)0x0);
                                                openhevc_pps_local._4_4_ = -1;
                                              }
                                            }
                                            else {
                                              _mpp_log_l(4,"H265PARSER_PS",
                                                         "num_tile_columns diff \n",(char *)0x0);
                                              openhevc_pps_local._4_4_ = -1;
                                            }
                                          }
                                          else {
                                            _mpp_log_l(4,"H265PARSER_PS",
                                                       "entropy_coding_sync_enabled_flag diff \n",
                                                       (char *)0x0);
                                            openhevc_pps_local._4_4_ = -1;
                                          }
                                        }
                                        else {
                                          _mpp_log_l(4,"H265PARSER_PS","tiles_enabled_flag diff \n",
                                                     (char *)0x0);
                                          openhevc_pps_local._4_4_ = -1;
                                        }
                                      }
                                      else {
                                        _mpp_log_l(4,"H265PARSER_PS",
                                                   "dependent_slice_segments_enabled_flag diff \n",
                                                   (char *)0x0);
                                        openhevc_pps_local._4_4_ = -1;
                                      }
                                    }
                                    else {
                                      _mpp_log_l(4,"H265PARSER_PS",
                                                 "transquant_bypass_enable_flag diff \n",(char *)0x0
                                                );
                                      openhevc_pps_local._4_4_ = -1;
                                    }
                                  }
                                  else {
                                    _mpp_log_l(4,"H265PARSER_PS","output_flag_present_flag diff \n",
                                               (char *)0x0);
                                    openhevc_pps_local._4_4_ = -1;
                                  }
                                }
                                else {
                                  _mpp_log_l(4,"H265PARSER_PS","weighted_bipred_flag diff \n",
                                             (char *)0x0);
                                  openhevc_pps_local._4_4_ = -1;
                                }
                              }
                              else {
                                _mpp_log_l(4,"H265PARSER_PS","weighted_pred_flag diff \n",
                                           (char *)0x0);
                                openhevc_pps_local._4_4_ = -1;
                              }
                            }
                            else {
                              _mpp_log_l(4,"H265PARSER_PS",
                                         "pic_slice_level_chroma_qp_offsets_present_flag diff \n",
                                         (char *)0x0);
                              openhevc_pps_local._4_4_ = -1;
                            }
                          }
                          else {
                            _mpp_log_l(4,"H265PARSER_PS","cr_qp_offset diff \n",(char *)0x0);
                            openhevc_pps_local._4_4_ = -1;
                          }
                        }
                        else {
                          _mpp_log_l(4,"H265PARSER_PS","cb_qp_offset diff \n",(char *)0x0);
                          openhevc_pps_local._4_4_ = -1;
                        }
                      }
                      else {
                        _mpp_log_l(4,"H265PARSER_PS","diff_cu_qp_delta_depth diff \n",(char *)0x0);
                        openhevc_pps_local._4_4_ = -1;
                      }
                    }
                    else {
                      _mpp_log_l(4,"H265PARSER_PS","cu_qp_delta_enabled_flag diff \n",(char *)0x0);
                      openhevc_pps_local._4_4_ = -1;
                    }
                  }
                  else {
                    _mpp_log_l(4,"H265PARSER_PS","transform_skip_enabled_flag diff \n",(char *)0x0);
                    openhevc_pps_local._4_4_ = -1;
                  }
                }
                else {
                  _mpp_log_l(4,"H265PARSER_PS","constrained_intra_pred_flag diff \n",(char *)0x0);
                  openhevc_pps_local._4_4_ = -1;
                }
              }
              else {
                _mpp_log_l(4,"H265PARSER_PS","pic_init_qp_minus26 diff \n",(char *)0x0);
                openhevc_pps_local._4_4_ = -1;
              }
            }
            else {
              _mpp_log_l(4,"H265PARSER_PS","num_ref_idx_l1_default_active diff \n",(char *)0x0);
              openhevc_pps_local._4_4_ = -1;
            }
          }
          else {
            _mpp_log_l(4,"H265PARSER_PS","num_ref_idx_l0_default_active diff \n",(char *)0x0);
            openhevc_pps_local._4_4_ = -1;
          }
        }
        else {
          _mpp_log_l(4,"H265PARSER_PS","cabac_init_present_flag diff \n",(char *)0x0);
          openhevc_pps_local._4_4_ = -1;
        }
      }
      else {
        _mpp_log_l(4,"H265PARSER_PS","sign_data_hiding_flag diff \n",(char *)0x0);
        openhevc_pps_local._4_4_ = -1;
      }
    }
    else {
      _mpp_log_l(4,"H265PARSER_PS","pps_id diff \n",(char *)0x0);
      openhevc_pps_local._4_4_ = -1;
    }
  }
  else {
    _mpp_log_l(4,"H265PARSER_PS","sps_id diff \n",(char *)0x0);
    openhevc_pps_local._4_4_ = -1;
  }
  return openhevc_pps_local._4_4_;
}

Assistant:

static RK_S32 compare_pps(HEVCPPS *openhevc_pps, HEVCPPS *pps)
{

    if (openhevc_pps->sps_id != pps->sps_id) {
        mpp_log("sps_id diff \n");
        return -1;
    }

    if (openhevc_pps->pps_id != pps->pps_id) {
        mpp_log("pps_id diff \n");
        return -1;
    }

    if (openhevc_pps->sign_data_hiding_flag != pps->sign_data_hiding_flag) {
        mpp_log("sign_data_hiding_flag diff \n");
        return -1;
    }

    if (openhevc_pps->cabac_init_present_flag != pps->cabac_init_present_flag) {
        mpp_log("cabac_init_present_flag diff \n");
        return -1;
    }

    if (openhevc_pps->num_ref_idx_l0_default_active != pps->num_ref_idx_l0_default_active) {
        mpp_log("num_ref_idx_l0_default_active diff \n");
        return -1;
    }
    if (openhevc_pps->num_ref_idx_l1_default_active != pps->num_ref_idx_l1_default_active) {
        mpp_log("num_ref_idx_l1_default_active diff \n");
        return -1;
    }
    if (openhevc_pps->pic_init_qp_minus26 != pps->pic_init_qp_minus26) {
        mpp_log("pic_init_qp_minus26 diff \n");
        return -1;
    }

    if (openhevc_pps->constrained_intra_pred_flag != pps->constrained_intra_pred_flag) {
        mpp_log("constrained_intra_pred_flag diff \n");
        return -1;
    }
    if (openhevc_pps->transform_skip_enabled_flag != pps->transform_skip_enabled_flag) {
        mpp_log("transform_skip_enabled_flag diff \n");
        return -1;
    }

    if (openhevc_pps->cu_qp_delta_enabled_flag != pps->cu_qp_delta_enabled_flag) {
        mpp_log("cu_qp_delta_enabled_flag diff \n");
        return -1;
    }
    if (openhevc_pps->diff_cu_qp_delta_depth != pps->diff_cu_qp_delta_depth) {
        mpp_log("diff_cu_qp_delta_depth diff \n");
        return -1;
    }

    if (openhevc_pps->cb_qp_offset != pps->cb_qp_offset) {
        mpp_log("cb_qp_offset diff \n");
        return -1;
    }

    if (openhevc_pps->cr_qp_offset != pps->cr_qp_offset) {
        mpp_log("cr_qp_offset diff \n");
        return -1;
    }

    if (openhevc_pps->pic_slice_level_chroma_qp_offsets_present_flag !=
        pps->pic_slice_level_chroma_qp_offsets_present_flag) {
        mpp_log("pic_slice_level_chroma_qp_offsets_present_flag diff \n");
        return -1;
    }
    if (openhevc_pps->weighted_pred_flag != pps->weighted_pred_flag) {
        mpp_log("weighted_pred_flag diff \n");
        return -1;
    }
    if (openhevc_pps->weighted_bipred_flag != pps->weighted_bipred_flag) {
        mpp_log("weighted_bipred_flag diff \n");
        return -1;
    }
    if (openhevc_pps->output_flag_present_flag != pps->output_flag_present_flag) {
        mpp_log("output_flag_present_flag diff \n");
        return -1;
    }
    if (openhevc_pps->transquant_bypass_enable_flag !=
        pps->transquant_bypass_enable_flag) {
        mpp_log("transquant_bypass_enable_flag diff \n");
        return -1;
    }

    if (openhevc_pps->dependent_slice_segments_enabled_flag !=
        pps->dependent_slice_segments_enabled_flag) {
        mpp_log("dependent_slice_segments_enabled_flag diff \n");
        return -1;
    }
    if (openhevc_pps->tiles_enabled_flag != pps->tiles_enabled_flag) {
        mpp_log("tiles_enabled_flag diff \n");
        return -1;
    }
    if (openhevc_pps->entropy_coding_sync_enabled_flag !=
        pps->entropy_coding_sync_enabled_flag) {
        mpp_log("entropy_coding_sync_enabled_flag diff \n");
        return -1;
    }

    if (openhevc_pps->num_tile_columns != pps->num_tile_columns) {
        mpp_log("num_tile_columns diff \n");
        return -1;
    }
    if (openhevc_pps->num_tile_rows != pps->num_tile_rows) {
        mpp_log("num_tile_rows diff \n");
        return -1;
    }
    if (openhevc_pps->uniform_spacing_flag != pps->uniform_spacing_flag) {
        mpp_log("qp_bd_offset diff \n");
        return -1;
    }
    if (openhevc_pps->loop_filter_across_tiles_enabled_flag !=
        pps->loop_filter_across_tiles_enabled_flag) {
        mpp_log("loop_filter_across_tiles_enabled_flag diff \n");
        return -1;
    }

    if (openhevc_pps->seq_loop_filter_across_slices_enabled_flag !=
        pps->seq_loop_filter_across_slices_enabled_flag) {
        mpp_log("seq_loop_filter_across_slices_enabled_flag diff \n");
        return -1;
    }

    if (openhevc_pps->deblocking_filter_control_present_flag !=
        pps->deblocking_filter_control_present_flag) {
        mpp_log("deblocking_filter_control_present_flag diff \n");
        return -1;
    }
    if (openhevc_pps->deblocking_filter_override_enabled_flag !=
        pps->deblocking_filter_override_enabled_flag) {
        mpp_log("deblocking_filter_override_enabled_flag diff \n");
        return -1;
    }
    if (openhevc_pps->disable_dbf != pps->disable_dbf) {
        mpp_log("disable_dbf diff \n");
        return -1;
    }
    if (openhevc_pps->beta_offset != pps->beta_offset) {
        mpp_log("beta_offset diff \n");
        return -1;
    }
    if (openhevc_pps->tc_offset != pps->tc_offset) {
        mpp_log("tc_offset diff \n");
        return -1;
    }

    if (openhevc_pps->scaling_list_data_present_flag !=
        pps->scaling_list_data_present_flag) {
        mpp_log("scaling_list_data_present_flag diff \n");
        return -1;
    }

    if (openhevc_pps->lists_modification_present_flag !=
        pps->lists_modification_present_flag) {
        mpp_log("lists_modification_present_flag diff \n");
        return -1;
    }
    if (openhevc_pps->log2_parallel_merge_level != pps->log2_parallel_merge_level) {
        mpp_log("log2_parallel_merge_level diff \n");
        return -1;
    }
    if (openhevc_pps->num_extra_slice_header_bits !=
        pps->num_extra_slice_header_bits) {
        mpp_log("num_extra_slice_header_bits diff \n");
        return -1;
    }
#if 0
    if (openhevc_pps->slice_header_extension_present_flag !=
        pps->slice_header_extension_present_flag) {
        mpp_log("slice_header_extension_present_flag diff \n");
        return -1;
    }

    if (openhevc_pps->pps_extension_flag != pps->pps_extension_flag) {
        mpp_log("pps_extension_flag diff \n");
        return -1;
    }
    if (openhevc_pps->pps_extension_data_flag != pps->pps_extension_data_flag) {
        mpp_log("pps_extension_data_flag diff \n");
        return -1;
    }
#endif
    return 0;

}